

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * cargo_get_vfprint_args
                 (int argc,char **argv,int start,cargo_fprint_flags_t flags,size_t max_width,
                 size_t highlight_count,__va_list_tag *ap)

{
  uint uVar1;
  undefined8 *local_78;
  int *local_60;
  cargo_highlight_t *local_48;
  cargo_highlight_t *highlights;
  char *pcStack_38;
  int i;
  char *ret;
  size_t highlight_count_local;
  size_t max_width_local;
  cargo_fprint_flags_t flags_local;
  int start_local;
  char **argv_local;
  int argc_local;
  
  pcStack_38 = (char *)0x0;
  local_48 = (cargo_highlight_t *)0x0;
  ret = (char *)highlight_count;
  highlight_count_local = max_width;
  max_width_local._0_4_ = flags;
  max_width_local._4_4_ = start;
  _flags_local = argv;
  argv_local._4_4_ = argc;
  local_48 = (cargo_highlight_t *)_cargo_calloc(highlight_count,0x10);
  if (local_48 != (cargo_highlight_t *)0x0) {
    for (highlights._4_4_ = 0; highlights._4_4_ < (int)ret; highlights._4_4_ = highlights._4_4_ + 1)
    {
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_60 = (int *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_60 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_60 + 2;
      }
      local_48[highlights._4_4_].i = *local_60;
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_78 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_78 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_78 + 1;
      }
      local_48[highlights._4_4_].c = (char *)*local_78;
    }
    pcStack_38 = cargo_get_fprintl_args
                           (argv_local._4_4_,_flags_local,max_width_local._4_4_,
                            (cargo_fprint_flags_t)max_width_local,highlight_count_local,(size_t)ret,
                            local_48);
  }
  _cargo_xfree(&local_48);
  return pcStack_38;
}

Assistant:

char *cargo_get_vfprint_args(int argc, char **argv, int start,
                            cargo_fprint_flags_t flags,
                            size_t max_width,
                            size_t highlight_count, va_list ap)
{
    char *ret = NULL;
    int i;
    cargo_highlight_t *highlights = NULL;

    // Create a list of indices to highlight from the va_args.
    if (!(highlights = _cargo_calloc(highlight_count, sizeof(cargo_highlight_t))))
    {
        CARGODBG(1, "Out of memory trying to allocate %lu highlights!\n",
                highlight_count);
        goto fail;
    }

    for (i = 0; i < (int)highlight_count; i++)
    {
        highlights[i].i = va_arg(ap, int);
        highlights[i].c = va_arg(ap, char *);
    }

    ret = cargo_get_fprintl_args(argc, argv, start, flags, max_width,
                                highlight_count, highlights);

fail:
    _cargo_xfree(&highlights);

    return ret;
}